

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>::dx
          (FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_> *this,int i)

{
  double dVar1;
  double *pdVar2;
  undefined8 *in_RDI;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  int in_stack_ffffffffffffffbc;
  FadExpr<FadFuncCosh<Fad<double>_>_> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  double dVar7;
  Fad<double> *in_stack_ffffffffffffffd0;
  
  pdVar2 = Fad<double>::dx(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                          );
  dVar7 = *pdVar2;
  vVar3 = FadExpr<FadFuncCosh<Fad<double>_>_>::val((FadExpr<FadFuncCosh<Fad<double>_>_> *)0x1efefbe)
  ;
  vVar4 = FadExpr<FadFuncCosh<Fad<double>_>_>::dx
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  pdVar2 = Fad<double>::val((Fad<double> *)*in_RDI);
  dVar1 = *pdVar2;
  vVar5 = FadExpr<FadFuncCosh<Fad<double>_>_>::val((FadExpr<FadFuncCosh<Fad<double>_>_> *)0x1eff035)
  ;
  vVar6 = FadExpr<FadFuncCosh<Fad<double>_>_>::val((FadExpr<FadFuncCosh<Fad<double>_>_> *)0x1eff049)
  ;
  return (dVar7 * vVar3 + -(vVar4 * dVar1)) / (vVar5 * vVar6);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}